

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDARcheck2(IDAMem IDA_mem)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  N_Vector unaff_retaddr;
  N_Vector in_stack_00000008;
  sunrealtype in_stack_00000010;
  int zroot;
  sunrealtype tplus;
  sunrealtype hratio;
  sunrealtype smallh;
  int retval;
  int i;
  double local_40;
  int local_14;
  int local_4;
  
  if (*(int *)(in_RDI + 0x494) == 0) {
    local_4 = 0;
  }
  else {
    IDAGetSolution((void *)tplus,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    iVar2 = (**(code **)(in_RDI + 0x430))
                      (*(undefined8 *)(in_RDI + 0x450),*(undefined8 *)(in_RDI + 0x188),
                       *(undefined8 *)(in_RDI + 400),*(undefined8 *)(in_RDI + 0x468),
                       *(undefined8 *)(in_RDI + 0x18));
    *(long *)(in_RDI + 0x498) = *(long *)(in_RDI + 0x498) + 1;
    if (iVar2 == 0) {
      bVar1 = false;
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) = 0;
      }
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
        if (((*(int *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) != 0) &&
            (dVar3 = ABS(*(double *)(*(long *)(in_RDI + 0x468) + (long)local_14 * 8)), dVar3 == 0.0)
            ) && (!NAN(dVar3))) {
          bVar1 = true;
          *(undefined4 *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) = 1;
        }
      }
      if (bVar1) {
        *(double *)(in_RDI + 0x488) =
             (ABS(*(double *)(in_RDI + 0x2a8)) + ABS(*(double *)(in_RDI + 0x290))) *
             *(double *)(in_RDI + 8) * 100.0;
        if (*(double *)(in_RDI + 0x290) <= 0.0) {
          local_40 = -*(double *)(in_RDI + 0x488);
        }
        else {
          local_40 = *(double *)(in_RDI + 0x488);
        }
        dVar3 = *(double *)(in_RDI + 0x450) + local_40;
        if ((dVar3 - *(double *)(in_RDI + 0x2a8)) * *(double *)(in_RDI + 0x290) < 0.0) {
          IDAGetSolution((void *)tplus,in_stack_00000010,in_stack_00000008,unaff_retaddr);
        }
        else {
          N_VLinearSum(0x3ff0000000000000,local_40 / *(double *)(in_RDI + 0x290),
                       *(undefined8 *)(in_RDI + 0x188),*(undefined8 *)(in_RDI + 0x68),
                       *(undefined8 *)(in_RDI + 0x188));
        }
        iVar2 = (**(code **)(in_RDI + 0x430))
                          (dVar3,*(undefined8 *)(in_RDI + 0x188),*(undefined8 *)(in_RDI + 400),
                           *(undefined8 *)(in_RDI + 0x470),*(undefined8 *)(in_RDI + 0x18));
        *(long *)(in_RDI + 0x498) = *(long *)(in_RDI + 0x498) + 1;
        if (iVar2 == 0) {
          bVar1 = false;
          for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
            if (*(int *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) != 0) {
              dVar3 = ABS(*(double *)(*(long *)(in_RDI + 0x470) + (long)local_14 * 8));
              if ((dVar3 != 0.0) || (NAN(dVar3))) {
                if (*(int *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) == 1) {
                  *(undefined8 *)(*(long *)(in_RDI + 0x468) + (long)local_14 * 8) =
                       *(undefined8 *)(*(long *)(in_RDI + 0x470) + (long)local_14 * 8);
                }
              }
              else {
                if (*(int *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) == 1) {
                  return 3;
                }
                bVar1 = true;
                *(undefined4 *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) = 1;
              }
            }
          }
          if (bVar1) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = -10;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = -10;
    }
  }
  return local_4;
}

Assistant:

static int IDARcheck2(IDAMem IDA_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  if (IDA_mem->ida_irfnd == 0) { return (IDA_SUCCESS); }

  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_tlo, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  retval = IDA_mem->ida_gfun(IDA_mem->ida_tlo, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_glo, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++) { IDA_mem->ida_iroots[i] = 0; }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if (SUNRabs(IDA_mem->ida_glo[i]) == ZERO)
    {
      zroot                  = SUNTRUE;
      IDA_mem->ida_iroots[i] = 1;
    }
  }
  if (!zroot) { return (IDA_SUCCESS); }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  smallh = (IDA_mem->ida_hh > ZERO) ? IDA_mem->ida_ttol : -IDA_mem->ida_ttol;
  tplus  = IDA_mem->ida_tlo + smallh;
  if ((tplus - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
  {
    hratio = smallh / IDA_mem->ida_hh;
    N_VLinearSum(ONE, IDA_mem->ida_yy, hratio, IDA_mem->ida_phi[1],
                 IDA_mem->ida_yy);
  }
  else
  {
    (void)IDAGetSolution(IDA_mem, tplus, IDA_mem->ida_yy, IDA_mem->ida_yp);
  }
  retval = IDA_mem->ida_gfun(tplus, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if (SUNRabs(IDA_mem->ida_ghi[i]) == ZERO)
    {
      if (IDA_mem->ida_iroots[i] == 1) { return (CLOSERT); }
      zroot                  = SUNTRUE;
      IDA_mem->ida_iroots[i] = 1;
    }
    else
    {
      if (IDA_mem->ida_iroots[i] == 1)
      {
        IDA_mem->ida_glo[i] = IDA_mem->ida_ghi[i];
      }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (IDA_SUCCESS);
}